

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

__pid_t __thiscall cimg_library::cimg::wait(cimg *this,void *__stat_loc)

{
  time_t tVar1;
  ulong uVar2;
  cimg *__timer;
  ulong uVar3;
  ulong uVar4;
  
  __timer = this;
  if (*__stat_loc == 0) {
    tVar1 = time((time_t *)this);
    *(time_t *)__stat_loc = tVar1;
  }
  uVar2 = time((time_t *)__timer);
  uVar3 = ((ulong)this & 0xffffffff) + *__stat_loc;
  uVar4 = uVar3 - uVar2;
  if (uVar3 < uVar2 || uVar4 == 0) {
    *(ulong *)__stat_loc = uVar2;
    uVar4 = 0;
  }
  else {
    *(ulong *)__stat_loc = (uVar4 & 0xffffffff) + uVar2;
    sleep((uint)uVar4);
  }
  return (__pid_t)uVar4;
}

Assistant:

inline unsigned int wait(const unsigned int milliseconds, cimg_ulong *const p_timer) {
      if (!*p_timer) *p_timer = cimg::time();
      const cimg_ulong current_time = cimg::time();
      if (current_time>=*p_timer + milliseconds) { *p_timer = current_time; return 0; }
      const unsigned int time_diff = (unsigned int)(*p_timer + milliseconds - current_time);
      *p_timer = current_time + time_diff;
      cimg::sleep(time_diff);
      return time_diff;
    }